

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fopen.c
# Opt level: O0

char * dirslash(char *path)

{
  CURLcode CVar1;
  bool bVar2;
  undefined1 local_40 [8];
  dynbuf out;
  size_t n;
  char *path_local;
  
  Curl_dyn_init((dynbuf *)local_40,8000000);
  out.toobig = strlen(path);
  if (out.toobig != 0) {
    while( true ) {
      bVar2 = false;
      if (out.toobig != 0) {
        bVar2 = path[out.toobig - 1] != '/';
      }
      if (!bVar2) break;
      out.toobig = out.toobig - 1;
    }
    while( true ) {
      bVar2 = false;
      if (out.toobig != 0) {
        bVar2 = path[out.toobig - 1] == '/';
      }
      if (!bVar2) break;
      out.toobig = out.toobig - 1;
    }
  }
  CVar1 = Curl_dyn_addn((dynbuf *)local_40,path,out.toobig);
  if (CVar1 == CURLE_OK) {
    if ((out.toobig == 0) || (CVar1 = Curl_dyn_addn((dynbuf *)local_40,"/",1), CVar1 == CURLE_OK)) {
      path_local = Curl_dyn_ptr((dynbuf *)local_40);
    }
    else {
      path_local = (char *)0x0;
    }
  }
  else {
    path_local = (char *)0x0;
  }
  return path_local;
}

Assistant:

static char *dirslash(const char *path)
{
  size_t n;
  struct dynbuf out;
  DEBUGASSERT(path);
  Curl_dyn_init(&out, CURL_MAX_INPUT_LENGTH);
  n = strlen(path);
  if(n) {
    /* find the rightmost path separator, if any */
    while(n && !IS_SEP(path[n-1]))
      --n;
    /* skip over all the path separators, if any */
    while(n && IS_SEP(path[n-1]))
      --n;
  }
  if(Curl_dyn_addn(&out, path, n))
    return NULL;
  /* if there was a directory, append a single trailing slash */
  if(n && Curl_dyn_addn(&out, PATHSEP, 1))
    return NULL;
  return Curl_dyn_ptr(&out);
}